

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.h
# Opt level: O0

StringRef __thiscall llvm::Twine::getSingleStringRef(Twine *this)

{
  StringRef SVar1;
  bool bVar2;
  NodeKind NVar3;
  Twine *pTVar4;
  size_t local_80;
  Twine *this_local;
  size_t local_48;
  Child local_28;
  Twine **local_20;
  Twine *local_18;
  Twine **local_10;
  
  bVar2 = isSingleStringRef(this);
  if (bVar2) {
    NVar3 = getLHSKind(this);
    switch(NVar3) {
    case EmptyKind:
      memset(&this_local,0,0x10);
      StringRef::StringRef((StringRef *)&this_local);
      break;
    default:
      llvm_unreachable_internal
                ("Out of sync with isSingleStringRef",
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/Twine.h"
                 ,0x1b8);
    case CStringKind:
      this_local = (this->LHS).twine;
      local_10 = &this_local;
      if (this_local == (Twine *)0x0) {
        local_80 = 0;
      }
      else {
        local_18 = this_local;
        local_80 = strlen((char *)this_local);
      }
      local_48 = local_80;
      break;
    case StdStringKind:
      local_28 = this->LHS;
      local_20 = &this_local;
      this_local = (Twine *)std::__cxx11::string::data();
      local_48 = std::__cxx11::string::length();
      break;
    case StringRefKind:
      this_local = (Twine *)*(this->LHS).decUL;
      local_48 = (this->LHS).decUL[1];
      break;
    case SmallStringKind:
      pTVar4 = (Twine *)SmallVectorTemplateCommon<char,_void>::data
                                  ((SmallVectorTemplateCommon<char,_void> *)(this->LHS).twine);
      local_48 = SmallVectorBase::size((SmallVectorBase *)(this->LHS).twine);
      this_local = pTVar4;
    }
    SVar1.Length = local_48;
    SVar1.Data = (char *)this_local;
    return SVar1;
  }
  __assert_fail("isSingleStringRef() &&\"This cannot be had as a single stringref!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/Twine.h"
                ,0x1b6,"StringRef llvm::Twine::getSingleStringRef() const");
}

Assistant:

StringRef getSingleStringRef() const {
      assert(isSingleStringRef() &&"This cannot be had as a single stringref!");
      switch (getLHSKind()) {
      default: llvm_unreachable("Out of sync with isSingleStringRef");
      case EmptyKind:      return StringRef();
      case CStringKind:    return StringRef(LHS.cString);
      case StdStringKind:  return StringRef(*LHS.stdString);
      case StringRefKind:  return *LHS.stringRef;
      case SmallStringKind:
        return StringRef(LHS.smallString->data(), LHS.smallString->size());
      }
    }